

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O3

void __thiscall
cbtAlignedObjectArray<ChUll_*>::quickSortInternal<ChUllSort>
          (cbtAlignedObjectArray<ChUll_*> *this,ChUllSort *CompareFunc,int lo,int hi)

{
  float fVar1;
  ChUll **ppCVar2;
  ChUll *pCVar3;
  long lVar4;
  int iVar5;
  int hi_00;
  int iVar6;
  long lVar7;
  ChUll *temp;
  long lVar8;
  
  do {
    fVar1 = this->m_data[(lo + hi) / 2]->mVolume;
    iVar6 = lo;
    hi_00 = hi;
    do {
      ppCVar2 = this->m_data;
      lVar7 = (long)iVar6 + -1;
      iVar5 = iVar6;
      do {
        iVar6 = iVar5;
        pCVar3 = ppCVar2[lVar7 + 1];
        lVar7 = lVar7 + 1;
        iVar5 = iVar6 + 1;
      } while (pCVar3->mVolume < fVar1);
      lVar8 = (long)hi_00 + 1;
      iVar5 = hi_00;
      do {
        hi_00 = iVar5;
        lVar4 = lVar8 + -1;
        lVar8 = lVar8 + -1;
        iVar5 = hi_00 + -1;
      } while (fVar1 < ppCVar2[lVar4]->mVolume);
      if (lVar7 <= lVar8) {
        ppCVar2[lVar7] = ppCVar2[lVar4];
        this->m_data[lVar8] = pCVar3;
        iVar6 = iVar6 + 1;
        hi_00 = hi_00 + -1;
      }
    } while (iVar6 <= hi_00);
    if (lo < hi_00) {
      quickSortInternal<ChUllSort>(this,CompareFunc,lo,hi_00);
    }
    lo = iVar6;
  } while (iVar6 < hi);
  return;
}

Assistant:

void quickSortInternal(const L& CompareFunc, int lo, int hi)
	{
		//  lo is the lower index, hi is the upper index
		//  of the region of array a that is to be sorted
		int i = lo, j = hi;
		T x = m_data[(lo + hi) / 2];

		//  partition
		do
		{
			while (CompareFunc(m_data[i], x))
				i++;
			while (CompareFunc(x, m_data[j]))
				j--;
			if (i <= j)
			{
				swap(i, j);
				i++;
				j--;
			}
		} while (i <= j);

		//  recursion
		if (lo < j)
			quickSortInternal(CompareFunc, lo, j);
		if (i < hi)
			quickSortInternal(CompareFunc, i, hi);
	}